

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion *
quaternion_set_from_axis_anglef3(quaternion *self,double x,double y,double z,double angle)

{
  quaternion *pqVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = sin(angle * 0.5);
  dVar3 = cos(angle * 0.5);
  (self->field_0).q[0] = x * dVar2;
  (self->field_0).q[1] = y * dVar2;
  (self->field_0).q[2] = z * dVar2;
  (self->field_0).q[3] = dVar3;
  pqVar1 = quaternion_normalize(self);
  return pqVar1;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_axis_anglef3(struct quaternion *self, HYP_FLOAT x, HYP_FLOAT y, HYP_FLOAT z, HYP_FLOAT angle)
{
	HYP_FLOAT s = HYP_SIN(angle / 2.0f);
	HYP_FLOAT c = HYP_COS(angle / 2.0f);

	self->x = x * s;
	self->y = y * s;
	self->z = z * s;
	self->w = c;

	/* reduce rounding errors caused by sin/cos */
	return quaternion_normalize(self);
}